

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferQueryTest::iterate(MutableRenderBufferQueryTest *this)

{
  deUint32 dVar1;
  Library *pLVar2;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  EGLint curRenderBuffer;
  
  pLVar2 = EglTestContext::getLibrary
                     ((this->super_MutableRenderBufferTest).super_TestCase.m_eglTestCtx);
  curRenderBuffer = -1;
  (*pLVar2->_vptr_Library[0x2b])
            (pLVar2,(this->super_MutableRenderBufferTest).m_eglDisplay,
             (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,&curRenderBuffer);
  dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(dVar1,
                   "querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0x124);
  if (curRenderBuffer == 0x3084) {
    (*pLVar2->_vptr_Library[0x30])
              (pLVar2,(this->super_MutableRenderBufferTest).m_eglDisplay,
               (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,0x3085);
    dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
    eglu::checkError(dVar1,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                     ,300);
    (*pLVar2->_vptr_Library[0x2b])
              (pLVar2,(this->super_MutableRenderBufferTest).m_eglDisplay,
               (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,&curRenderBuffer);
    dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
    eglu::checkError(dVar1,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                     ,0x12d);
    if (curRenderBuffer == 0x3085) {
      (*pLVar2->_vptr_Library[0x30])
                (pLVar2,(this->super_MutableRenderBufferTest).m_eglDisplay,
                 (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,0x3084);
      dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
      eglu::checkError(dVar1,
                       "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                       ,0x135);
      (*pLVar2->_vptr_Library[0x2b])
                (pLVar2,(this->super_MutableRenderBufferTest).m_eglDisplay,
                 (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,&curRenderBuffer);
      dVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
      eglu::checkError(dVar1,
                       "querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                       ,0x136);
      this_00 = (this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      if (curRenderBuffer == 0x3084) {
        description = "Pass";
        testResult = QP_TEST_RESULT_PASS;
        goto LAB_0023c57e;
      }
      description = "Surface didn\'t switch back to back-buffer rendering";
    }
    else {
      this_00 = (this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      description = "Surface didn\'t switch to single-buffer rendering";
    }
  }
  else {
    this_00 = (this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Surface didn\'t default to back-buffered rendering";
  }
  testResult = QP_TEST_RESULT_FAIL;
LAB_0023c57e:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

TestCase::IterateResult MutableRenderBufferQueryTest::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	// check that by default the query returns back buffered
	EGLint curRenderBuffer = -1;
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer));
	if (curRenderBuffer != EGL_BACK_BUFFER)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface didn't default to back-buffered rendering");
		return STOP;
	}

	// switch to single-buffer rendering and check that the query output changed
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER));
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer));
	if (curRenderBuffer != EGL_SINGLE_BUFFER)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface didn't switch to single-buffer rendering");
		return STOP;
	}

	// switch back to back-buffer rendering and check the query again
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER));
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer));
	if (curRenderBuffer != EGL_BACK_BUFFER)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface didn't switch back to back-buffer rendering");
		return STOP;
	}
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}